

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall ot::commissioner::CommissionerImpl::Disconnect(CommissionerImpl *this)

{
  char cVar1;
  pointer puVar2;
  char *to;
  char *from;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  local_58.types_[0] = none_type;
  from = "the CoAPs client was disconnected";
  local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "the CoAPs client was disconnected";
  local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x21;
  local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
  local_58.parse_funcs_[0] = (parse_func)0x0;
  write.handler_ = &local_58;
  local_58.context_.types_ = local_58.types_;
  do {
    if (from == "") {
LAB_0016f840:
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_a0,(v10 *)"the CoAPs client was disconnected",(string_view)ZEXT816(0x21),
                 args);
      local_80._0_4_ = kCancelled;
      std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
      coap::CoapSecure::Disconnect(&this->mBrClient,(Error *)local_80);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      std::__cxx11::string::~string((string *)&local_a0);
      puVar2 = (this->mProxyClient).mMeshLocalPrefix.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->mProxyClient).mMeshLocalPrefix.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar2) {
        (this->mProxyClient).mMeshLocalPrefix.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
      }
      this->mState = kDisabled;
      return;
    }
    cVar1 = *from;
    to = from;
    while (cVar1 != '{') {
      to = to + 1;
      if (to == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,from,"");
        goto LAB_0016f840;
      }
      cVar1 = *to;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
    operator()(&write,from,to);
    from = ::fmt::v10::detail::
           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                     (to,"",&local_58);
  } while( true );
}

Assistant:

void CommissionerImpl::Disconnect()
{
    mBrClient.Disconnect(ERROR_CANCELLED("the CoAPs client was disconnected"));
    mProxyClient.ClearMeshLocalPrefix();
    mState = State::kDisabled;
}